

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_scaling_list_data(codec_t *ps_codec,WORD16 *pi2_scaling_mat)

{
  undefined2 uVar1;
  undefined2 uVar2;
  UWORD32 UVar3;
  int iVar4;
  WORD32 WVar5;
  uint uVar6;
  undefined2 *__dest;
  long in_RSI;
  long in_RDI;
  WORD32 num_elements;
  WORD32 scaling_list_delta_coef;
  WORD32 scaling_list_pred_mode_flag;
  UWORD8 *scan_table;
  WORD32 scaling_mat_offset [20];
  WORD16 *pi2_scaling_mat_offset;
  bitstrm_t *ps_bitstrm;
  WORD32 offset;
  WORD32 j;
  WORD32 i;
  WORD32 coef_num;
  WORD32 next_coef;
  WORD32 dc_value;
  WORD32 value;
  WORD32 matrix_id;
  WORD32 size_id;
  IHEVCD_ERROR_T ret;
  int local_b8;
  UWORD32 local_b4;
  UWORD32 local_b0;
  bitstrm_t *in_stack_ffffffffffffff60;
  bitstrm_t *in_stack_ffffffffffffff68;
  int local_34;
  int local_30;
  int local_28;
  UWORD32 local_1c;
  int local_18;
  
  memcpy(&stack0xffffffffffffff68,&DAT_002df340,0x50);
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    local_1c = 0;
    while( true ) {
      iVar4 = 6;
      if (local_18 == 3) {
        iVar4 = 2;
      }
      if (iVar4 <= (int)local_1c) break;
      UVar3 = ihevcd_bits_get((bitstrm_t *)(in_RDI + 0x218),1);
      __dest = (undefined2 *)
               (in_RSI + (long)*(int *)(&stack0xffffffffffffff68 +
                                       (long)(int)(local_18 * 6 + local_1c) * 4) * 2);
      if (UVar3 == 0) {
        local_b4 = ihevcd_uev(in_stack_ffffffffffffff60);
        if ((int)local_1c < (int)local_b4) {
          local_b0 = local_1c;
        }
        else {
          if ((int)local_b4 < 0) {
            local_b4 = 0;
          }
          local_b0 = local_b4;
        }
        iVar4 = 1 << ((char)(local_18 << 1) + 4U & 0x1f);
        if (local_b0 != 0) {
          memcpy(__dest,__dest + -(long)(int)(local_b0 * iVar4),(long)iVar4 << 1);
        }
      }
      else {
        local_28 = 8;
        if (1 << ((char)(local_18 << 1) + 4U & 0x1f) < 0x41) {
          local_b8 = 1 << ((char)(local_18 << 1) + 4U & 0x1f);
        }
        else {
          local_b8 = 0x40;
        }
        if (local_18 < 2) {
          in_stack_ffffffffffffff60 = (bitstrm_t *)gapv_ihevc_invscan[local_18 + 1];
          for (local_30 = 0; local_30 < local_b8; local_30 = local_30 + 1) {
            WVar5 = ihevcd_sev(in_stack_ffffffffffffff68);
            local_28 = (local_28 + WVar5 + 0x100) % 0x100;
            __dest[*(byte *)((long)&in_stack_ffffffffffffff60->pu1_buf_base + (long)local_30)] =
                 (short)local_28;
          }
        }
        else {
          WVar5 = ihevcd_sev(in_stack_ffffffffffffff68);
          local_28 = WVar5 + 8;
          uVar1 = (undefined2)local_28;
          in_stack_ffffffffffffff60 = (bitstrm_t *)gapv_ihevc_invscan[2];
          if (local_18 == 2) {
            for (local_30 = 0; local_30 < local_b8; local_30 = local_30 + 1) {
              WVar5 = ihevcd_sev(in_stack_ffffffffffffff68);
              local_28 = (local_28 + WVar5 + 0x100) % 0x100;
              uVar6 = (uint)*(byte *)((long)&in_stack_ffffffffffffff60->pu1_buf_base +
                                     (long)local_30);
              iVar4 = ((int)uVar6 >> 3) * 0x20 + (uVar6 & 7) * 2;
              uVar2 = (undefined2)local_28;
              __dest[iVar4] = uVar2;
              __dest[iVar4 + 1] = uVar2;
              __dest[iVar4 + 0x10] = uVar2;
              __dest[iVar4 + 0x11] = uVar2;
            }
            *__dest = uVar1;
          }
          else {
            for (local_30 = 0; local_30 < local_b8; local_30 = local_30 + 1) {
              WVar5 = ihevcd_sev(in_stack_ffffffffffffff68);
              local_28 = (local_28 + WVar5 + 0x100) % 0x100;
              uVar6 = (uint)*(byte *)((long)&in_stack_ffffffffffffff60->pu1_buf_base +
                                     (long)local_30);
              iVar4 = ((int)uVar6 >> 3) * 0x80 + (uVar6 & 7) * 4;
              for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
                uVar2 = (undefined2)local_28;
                __dest[iVar4 + local_34 * 0x20] = uVar2;
                __dest[iVar4 + 1 + local_34 * 0x20] = uVar2;
                __dest[iVar4 + 2 + local_34 * 0x20] = uVar2;
                __dest[iVar4 + 3 + local_34 * 0x20] = uVar2;
              }
              *__dest = uVar1;
            }
          }
        }
      }
      local_1c = local_1c + 1;
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T  ihevcd_scaling_list_data(codec_t *ps_codec, WORD16 *pi2_scaling_mat)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 size_id;
    WORD32 matrix_id;
    WORD32 value, dc_value = 0;
    WORD32 next_coef;
    WORD32 coef_num;
    WORD32 i, j, offset;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD16 *pi2_scaling_mat_offset;
    WORD32 scaling_mat_offset[] = { 0, 16, 32, 48, 64, 80, 96, 160, 224, 288, 352, 416, 480, 736, 992, 1248, 1504, 1760, 2016, 3040 };
    UWORD8 *scan_table;

    for(size_id = 0; size_id < 4; size_id++)
    {
        for(matrix_id = 0; matrix_id < ((size_id == 3) ? 2 : 6); matrix_id++)
        {
            WORD32 scaling_list_pred_mode_flag;
            WORD32 scaling_list_delta_coef;
            BITS_PARSE("scaling_list_pred_mode_flag", scaling_list_pred_mode_flag, ps_bitstrm, 1);

            offset = size_id * 6 + matrix_id;
            pi2_scaling_mat_offset = pi2_scaling_mat + scaling_mat_offset[offset];

            if(!scaling_list_pred_mode_flag)
            {
                WORD32 num_elements;
                UEV_PARSE("scaling_list_pred_matrix_id_delta", value,
                          ps_bitstrm);
                value = CLIP3(value, 0, matrix_id);

                num_elements = (1 << (4 + (size_id << 1)));
                if(0 != value)
                    memcpy(pi2_scaling_mat_offset, pi2_scaling_mat_offset - value * num_elements, num_elements * sizeof(WORD16));
            }
            else
            {
                next_coef = 8;
                coef_num = MIN(64, (1 << (4 + (size_id << 1))));

                if(size_id > 1)
                {
                    SEV_PARSE("scaling_list_dc_coef_minus8", value,
                              ps_bitstrm);

                    next_coef = value + 8;
                    dc_value = next_coef;
                }
                if(size_id < 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[size_id + 1];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;
                        pi2_scaling_mat_offset[scan_table[i]] = next_coef;
                    }
                }
                else if(size_id == 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 16 * 2 + (offset & 0x7) * 2;
                        pi2_scaling_mat_offset[offset] = next_coef;
                        pi2_scaling_mat_offset[offset + 1] = next_coef;
                        pi2_scaling_mat_offset[offset + 16] = next_coef;
                        pi2_scaling_mat_offset[offset + 16 + 1] = next_coef;
                    }
                    pi2_scaling_mat_offset[0] = dc_value;
                }
                else
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 32 * 4 + (offset & 0x7) * 4;

                        for(j = 0; j < 4; j++)
                        {
                            pi2_scaling_mat_offset[offset + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 1 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 2 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 3 + j * 32] = next_coef;
                        }
                        pi2_scaling_mat_offset[0] = dc_value;
                    }
                }
            }
        }
    }

    return ret;
}